

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

SRes LzmaEncode(Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,CLzmaEncProps *props,
               Byte *propsEncoded,SizeT *propsSize,int writeEndMark,ICompressProgressPtr progress,
               ISzAllocPtr alloc,ISzAllocPtr allocBig)

{
  SRes SVar1;
  CLzmaEncHandle p;
  
  p = LzmaEnc_Create(alloc);
  if (p == (CLzmaEncHandle)0x0) {
    SVar1 = 2;
  }
  else {
    SVar1 = LzmaEnc_SetProps(p,props);
    if ((SVar1 == 0) && (SVar1 = LzmaEnc_WriteProperties(p,propsEncoded,propsSize), SVar1 == 0)) {
      SVar1 = LzmaEnc_MemEncode(p,dest,destLen,src,srcLen,writeEndMark,progress,alloc,allocBig);
    }
    LzmaEnc_Destroy(p,alloc,allocBig);
  }
  return SVar1;
}

Assistant:

SRes LzmaEncode(Byte *dest, SizeT *destLen, const Byte *src, SizeT srcLen,
    const CLzmaEncProps *props, Byte *propsEncoded, SizeT *propsSize, int writeEndMark,
    ICompressProgressPtr progress, ISzAllocPtr alloc, ISzAllocPtr allocBig)
{
  CLzmaEncHandle p = LzmaEnc_Create(alloc);
  SRes res;
  if (!p)
    return SZ_ERROR_MEM;

  res = LzmaEnc_SetProps(p, props);
  if (res == SZ_OK)
  {
    res = LzmaEnc_WriteProperties(p, propsEncoded, propsSize);
    if (res == SZ_OK)
      res = LzmaEnc_MemEncode(p, dest, destLen, src, srcLen,
          writeEndMark, progress, alloc, allocBig);
  }

  LzmaEnc_Destroy(p, alloc, allocBig);
  return res;
}